

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWriteAlphaPlane(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long in_RSI;
  FILE *in_RDI;
  uint32_t y;
  int a_stride;
  uint8_t *a;
  uint32_t height;
  uint32_t width;
  uint local_30;
  void *local_28;
  int local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    uVar1 = *(uint *)(in_RSI + 4);
    uVar2 = *(uint *)(in_RSI + 8);
    local_28 = *(void **)(in_RSI + 0x28);
    iVar3 = *(int *)(in_RSI + 0x3c);
    if (local_28 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      fprintf(in_RDI,"P5\n%u %u\n255\n",(ulong)uVar1,(ulong)uVar2);
      for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
        sVar4 = fwrite(local_28,(ulong)uVar1,1,in_RDI);
        if (sVar4 != 1) {
          return 0;
        }
        local_28 = (void *)((long)local_28 + (long)iVar3);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int WebPWriteAlphaPlane(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    const uint8_t* a = buffer->u.YUVA.a;
    const int a_stride = buffer->u.YUVA.a_stride;
    uint32_t y;

    if (a == NULL) return 0;

    fprintf(fout, "P5\n%u %u\n255\n", width, height);
    for (y = 0; y < height; ++y) {
      if (fwrite(a, width, 1, fout) != 1) return 0;
      a += a_stride;
    }
    return 1;
  }
}